

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type * __thiscall
QList<SafeSymbols>::takeLast(value_type *__return_storage_ptr__,QList<SafeSymbols> *this)

{
  iterator iVar1;
  
  (__return_storage_ptr__->excludedSymbols).q_hash.d = (Data *)0xaaaaaaaaaaaaaaaa;
  __return_storage_ptr__->index = -0x5555555555555556;
  (__return_storage_ptr__->expandedMacro).d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->expandedMacro).d.size = -0x5555555555555556;
  (__return_storage_ptr__->symbols).d.size = -0x5555555555555556;
  (__return_storage_ptr__->expandedMacro).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->symbols).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->symbols).d.ptr = (Symbol *)0xaaaaaaaaaaaaaaaa;
  iVar1 = end(this);
  SafeSymbols::SafeSymbols(__return_storage_ptr__,iVar1.i + -1);
  QtPrivate::QGenericArrayOps<SafeSymbols>::eraseLast((QGenericArrayOps<SafeSymbols> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }